

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void polyscope::validateName(string *name)

{
  long lVar1;
  bool bVar2;
  allocator local_49;
  string local_48;
  string local_28;
  
  bVar2 = std::operator==(name,"");
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_28,"name must not be the empty string",&local_49);
    error(&local_28);
    std::__cxx11::string::~string((string *)&local_28);
  }
  lVar1 = std::__cxx11::string::find((char *)name,0x25b9c5);
  if (lVar1 != -1) {
    std::__cxx11::string::string
              ((string *)&local_48,"name must not contain \'#\' characters",&local_49);
    error(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void validateName(const std::string& name) {
  if(name == "") polyscope::error("name must not be the empty string");
  if(name.find("#") != std::string::npos) polyscope::error("name must not contain '#' characters");
}